

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_corofile.cpp
# Opt level: O0

void create_file(string *filename,size_t file_size,
                vector<char,_std::allocator<char>_> *fill_with_vec)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  vector<char,_std::allocator<char>_> *in_RDX;
  ulong in_RSI;
  string *in_RDI;
  size_t i;
  int remain;
  int cnt;
  size_t fill_with_size;
  ofstream file;
  ulong local_240;
  long local_218 [64];
  vector<char,_std::allocator<char>_> *local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::ofstream::ofstream(local_218,in_RDI,_S_bin);
  uVar1 = *(undefined8 *)(local_218[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_218 + (int)uVar1);
  bVar2 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    sVar4 = std::vector<char,_std::allocator<char>_>::size(local_18);
    if ((local_10 != 0) && (sVar4 != 0)) {
      iVar3 = (int)(local_10 >> 0xc);
      for (local_240 = 0; local_240 < (ulong)(long)iVar3; local_240 = local_240 + 1) {
        pcVar5 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1183e0);
        std::ostream::write((char *)local_218,(long)pcVar5);
      }
      if (0 < (int)local_10 + iVar3 * -0x1000) {
        pcVar5 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x11841a);
        std::ostream::write((char *)local_218,(long)pcVar5);
      }
      std::ostream::flush();
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"create file failed\n");
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void create_file(std::string filename, size_t file_size,
                 const std::vector<char> &fill_with_vec) {
  std::ofstream file(filename, std::ios::binary);
  file.exceptions(std::ios_base::failbit | std::ios_base::badbit);

  if (!file) {
    std::cout << "create file failed\n";
    return;
  }
  size_t fill_with_size = fill_with_vec.size();
  if (file_size == 0 || fill_with_size == 0) {
    return;
  }
  int cnt = file_size / block_size;
  int remain = file_size - block_size * cnt;
  for (size_t i = 0; i < cnt; i++) {
    file.write(fill_with_vec.data(), block_size);
  }
  if (remain > 0) {
    file.write(fill_with_vec.data(), remain);
  }
  file.flush();  // can throw
  return;
}